

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Permutahedral_representation_iterators.h
# Opt level: O2

void __thiscall
Gudhi::coxeter_triangulation::
Coface_iterator<Gudhi::coxeter_triangulation::Permutahedral_representation<std::vector<int,_std::allocator<int>_>,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
::increment(Coface_iterator<Gudhi::coxeter_triangulation::Permutahedral_representation<std::vector<int,_std::allocator<int>_>,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
            *this)

{
  vector<Gudhi::coxeter_triangulation::Ordered_set_partition_iterator,_std::allocator<Gudhi::coxeter_triangulation::Ordered_set_partition_iterator>_>
  *this_00;
  pointer pOVar1;
  pointer pvVar2;
  uint uVar3;
  uint j;
  long lVar4;
  ulong uVar5;
  bool bVar6;
  uint local_3c;
  unsigned_long local_38;
  
  this_00 = &this->o_its_;
  lVar4 = 0;
  uVar5 = 0;
  do {
    uVar3 = this->k_ + 1;
    if (uVar3 <= uVar5) {
LAB_0012a2d9:
      if (uVar3 == (uint)uVar5) {
        Integer_combination_iterator::increment(&this->i_it_);
        if (((this->i_it_).is_end_ == true) && (((this->i_end_).is_end_ & 1U) != 0)) {
          this->is_end_ = true;
          return;
        }
        std::
        vector<Gudhi::coxeter_triangulation::Ordered_set_partition_iterator,_std::allocator<Gudhi::coxeter_triangulation::Ordered_set_partition_iterator>_>
        ::clear(this_00);
        lVar4 = 2;
        for (uVar5 = 0; uVar5 < this->k_ + 1; uVar5 = uVar5 + 1) {
          pvVar2 = (this->simplex_).partition_.
                   super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          local_38 = *(long *)((long)&(pvVar2->
                                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                      )._M_impl.super__Vector_impl_data + lVar4 * 4) -
                     *(long *)((long)pvVar2 + lVar4 * 4 + -8) >> 3;
          local_3c = (this->i_it_).value_.
                     super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                     super__Vector_impl_data._M_start[uVar5] + 1;
          std::
          vector<Gudhi::coxeter_triangulation::Ordered_set_partition_iterator,std::allocator<Gudhi::coxeter_triangulation::Ordered_set_partition_iterator>>
          ::emplace_back<unsigned_long,unsigned_int>
                    ((vector<Gudhi::coxeter_triangulation::Ordered_set_partition_iterator,std::allocator<Gudhi::coxeter_triangulation::Ordered_set_partition_iterator>>
                      *)this_00,&local_38,&local_3c);
          lVar4 = lVar4 + 6;
        }
      }
      else {
        lVar4 = 0;
        while (bVar6 = uVar5 != 0, uVar5 = uVar5 - 1, bVar6) {
          Ordered_set_partition_iterator::reinitialize
                    ((Ordered_set_partition_iterator *)
                     ((long)&(((this_00->
                               super__Vector_base<Gudhi::coxeter_triangulation::Ordered_set_partition_iterator,_std::allocator<Gudhi::coxeter_triangulation::Ordered_set_partition_iterator>_>
                               )._M_impl.super__Vector_impl_data._M_start)->s_end_).value_ + lVar4))
          ;
          lVar4 = lVar4 + 0x138;
        }
      }
      update_value(this);
      return;
    }
    pOVar1 = (this->o_its_).
             super__Vector_base<Gudhi::coxeter_triangulation::Ordered_set_partition_iterator,_std::allocator<Gudhi::coxeter_triangulation::Ordered_set_partition_iterator>_>
             ._M_impl.super__Vector_impl_data._M_start;
    Ordered_set_partition_iterator::increment
              ((Ordered_set_partition_iterator *)
               ((long)&(pOVar1->s_end_).value_.
                       super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
               + lVar4));
    if (((&pOVar1->is_end_)[lVar4] != true) || (((this->o_end_).is_end_ & 1U) == 0)) {
      uVar3 = this->k_ + 1;
      goto LAB_0012a2d9;
    }
    uVar5 = uVar5 + 1;
    lVar4 = lVar4 + 0x138;
  } while( true );
}

Assistant:

void increment() {
    uint i = 0;
    for (; i < k_ + 1; i++) {
      if (++(o_its_[i]) != o_end_) break;
    }
    if (i == k_ + 1) {
      if (++i_it_ == i_end_) {
        is_end_ = true;
        return;
      }
      o_its_.clear();
      for (uint j = 0; j < k_ + 1; j++)
        o_its_.emplace_back(simplex_.partition()[j].size(), (*i_it_)[j] + 1);
    } else
      for (uint j = 0; j < i; j++) o_its_[j].reinitialize();
    update_value();
  }